

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::onErrorResponse
          (ClientConductor *this,int64_t offendingCommandCorrelationId,int32_t errorCode,
          string *errorMessage)

{
  pointer pSVar1;
  pointer pPVar2;
  pointer pEVar3;
  pointer pCVar4;
  int iVar5;
  pointer pSVar6;
  pointer pCVar7;
  long lVar8;
  pointer pPVar9;
  pointer pEVar10;
  pointer pSVar11;
  pointer pPVar12;
  pointer pEVar13;
  pointer pCVar14;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pSVar11 = (this->m_subscriptions).
            super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pSVar1 - (long)pSVar11 >> 6) * -0x5555555555555555 >> 2;
  pSVar6 = pSVar11;
  if (0 < lVar8) {
    pSVar6 = pSVar11 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pSVar11 = pSVar11 + 2;
    do {
      if (pSVar11[-2].m_registrationId == offendingCommandCorrelationId) {
        pSVar11 = pSVar11 + -2;
        goto LAB_00142803;
      }
      if (pSVar11[-1].m_registrationId == offendingCommandCorrelationId) {
        pSVar11 = pSVar11 + -1;
        goto LAB_00142803;
      }
      if (pSVar11->m_registrationId == offendingCommandCorrelationId) goto LAB_00142803;
      if (pSVar11[1].m_registrationId == offendingCommandCorrelationId) {
        pSVar11 = pSVar11 + 1;
        goto LAB_00142803;
      }
      lVar8 = lVar8 + -1;
      pSVar11 = pSVar11 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pSVar1 - (long)pSVar6 >> 6) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_001427dd:
    pSVar11 = pSVar6;
    if (pSVar6->m_registrationId != offendingCommandCorrelationId) {
      pSVar11 = pSVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_001427d0:
    pSVar11 = pSVar6;
    if (pSVar6->m_registrationId != offendingCommandCorrelationId) {
      pSVar6 = pSVar6 + 1;
      goto LAB_001427dd;
    }
  }
  else {
    pSVar11 = pSVar1;
    if ((lVar8 == 3) &&
       (pSVar11 = pSVar6, pSVar6->m_registrationId != offendingCommandCorrelationId)) {
      pSVar6 = pSVar6 + 1;
      goto LAB_001427d0;
    }
  }
LAB_00142803:
  if (pSVar11 != pSVar1) {
    pSVar11->m_status = ERRORED_MEDIA_DRIVER;
    pSVar11->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pSVar11->m_errorMessage);
    goto LAB_00142adf;
  }
  pPVar12 = (this->m_publications).
            super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pPVar2 - (long)pPVar12 >> 4) * -0x71c71c71c71c71c7 >> 2;
  pPVar9 = pPVar12;
  if (0 < lVar8) {
    pPVar9 = pPVar12 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pPVar12 = pPVar12 + 2;
    do {
      if (pPVar12[-2].m_registrationId == offendingCommandCorrelationId) {
        pPVar12 = pPVar12 + -2;
        goto LAB_001428fa;
      }
      if (pPVar12[-1].m_registrationId == offendingCommandCorrelationId) {
        pPVar12 = pPVar12 + -1;
        goto LAB_001428fa;
      }
      if (pPVar12->m_registrationId == offendingCommandCorrelationId) goto LAB_001428fa;
      if (pPVar12[1].m_registrationId == offendingCommandCorrelationId) {
        pPVar12 = pPVar12 + 1;
        goto LAB_001428fa;
      }
      lVar8 = lVar8 + -1;
      pPVar12 = pPVar12 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pPVar2 - (long)pPVar9 >> 4) * -0x71c71c71c71c71c7;
  if (lVar8 == 1) {
LAB_001428d4:
    pPVar12 = pPVar9;
    if (pPVar9->m_registrationId != offendingCommandCorrelationId) {
      pPVar12 = pPVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_001428c7:
    pPVar12 = pPVar9;
    if (pPVar9->m_registrationId != offendingCommandCorrelationId) {
      pPVar9 = pPVar9 + 1;
      goto LAB_001428d4;
    }
  }
  else {
    pPVar12 = pPVar2;
    if ((lVar8 == 3) &&
       (pPVar12 = pPVar9, pPVar9->m_registrationId != offendingCommandCorrelationId)) {
      pPVar9 = pPVar9 + 1;
      goto LAB_001428c7;
    }
  }
LAB_001428fa:
  if (pPVar12 != pPVar2) {
    pPVar12->m_status = ERRORED_MEDIA_DRIVER;
    pPVar12->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pPVar12->m_errorMessage);
    goto LAB_00142adf;
  }
  pEVar13 = (this->m_exclusivePublications).
            super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pEVar3 - (long)pEVar13 >> 4) * -0x71c71c71c71c71c7 >> 2;
  pEVar10 = pEVar13;
  if (0 < lVar8) {
    pEVar10 = pEVar13 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pEVar13 = pEVar13 + 2;
    do {
      if (pEVar13[-2].m_registrationId == offendingCommandCorrelationId) {
        pEVar13 = pEVar13 + -2;
        goto LAB_001429e7;
      }
      if (pEVar13[-1].m_registrationId == offendingCommandCorrelationId) {
        pEVar13 = pEVar13 + -1;
        goto LAB_001429e7;
      }
      if (pEVar13->m_registrationId == offendingCommandCorrelationId) goto LAB_001429e7;
      if (pEVar13[1].m_registrationId == offendingCommandCorrelationId) {
        pEVar13 = pEVar13 + 1;
        goto LAB_001429e7;
      }
      lVar8 = lVar8 + -1;
      pEVar13 = pEVar13 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pEVar3 - (long)pEVar10 >> 4) * -0x71c71c71c71c71c7;
  if (lVar8 == 1) {
LAB_001429c1:
    pEVar13 = pEVar10;
    if (pEVar10->m_registrationId != offendingCommandCorrelationId) {
      pEVar13 = pEVar3;
    }
  }
  else if (lVar8 == 2) {
LAB_001429b4:
    pEVar13 = pEVar10;
    if (pEVar10->m_registrationId != offendingCommandCorrelationId) {
      pEVar10 = pEVar10 + 1;
      goto LAB_001429c1;
    }
  }
  else {
    pEVar13 = pEVar3;
    if ((lVar8 == 3) &&
       (pEVar13 = pEVar10, pEVar10->m_registrationId != offendingCommandCorrelationId)) {
      pEVar10 = pEVar10 + 1;
      goto LAB_001429b4;
    }
  }
LAB_001429e7:
  if (pEVar13 != pEVar3) {
    pEVar13->m_status = ERRORED_MEDIA_DRIVER;
    pEVar13->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pEVar13->m_errorMessage);
    goto LAB_00142adf;
  }
  pCVar14 = (this->m_counters).
            super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pCVar4 - (long)pCVar14 >> 5) * -0x5555555555555555 >> 2;
  pCVar7 = pCVar14;
  if (0 < lVar8) {
    pCVar7 = pCVar14 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pCVar14 = pCVar14 + 2;
    do {
      if (pCVar14[-2].m_registrationId == offendingCommandCorrelationId) {
        pCVar14 = pCVar14 + -2;
        goto LAB_00142ac4;
      }
      if (pCVar14[-1].m_registrationId == offendingCommandCorrelationId) {
        pCVar14 = pCVar14 + -1;
        goto LAB_00142ac4;
      }
      if (pCVar14->m_registrationId == offendingCommandCorrelationId) goto LAB_00142ac4;
      if (pCVar14[1].m_registrationId == offendingCommandCorrelationId) {
        pCVar14 = pCVar14 + 1;
        goto LAB_00142ac4;
      }
      lVar8 = lVar8 + -1;
      pCVar14 = pCVar14 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pCVar4 - (long)pCVar7 >> 5) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_00142aa5:
    pCVar14 = pCVar7;
    if (pCVar7->m_registrationId != offendingCommandCorrelationId) {
      pCVar14 = pCVar4;
    }
  }
  else if (lVar8 == 2) {
LAB_00142a9c:
    pCVar14 = pCVar7;
    if (pCVar7->m_registrationId != offendingCommandCorrelationId) {
      pCVar7 = pCVar7 + 1;
      goto LAB_00142aa5;
    }
  }
  else {
    pCVar14 = pCVar4;
    if ((lVar8 == 3) &&
       (pCVar14 = pCVar7, pCVar7->m_registrationId != offendingCommandCorrelationId)) {
      pCVar7 = pCVar7 + 1;
      goto LAB_00142a9c;
    }
  }
LAB_00142ac4:
  if (pCVar14 != pCVar4) {
    pCVar14->m_status = ERRORED_MEDIA_DRIVER;
    pCVar14->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pCVar14->m_errorMessage);
  }
LAB_00142adf:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onErrorResponse(
    std::int64_t offendingCommandCorrelationId,
    std::int32_t errorCode,
    const std::string& errorMessage)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [offendingCommandCorrelationId](const SubscriptionStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end())
    {
        (*subIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*subIt).m_errorCode = errorCode;
        (*subIt).m_errorMessage = errorMessage;
        return;
    }

    auto pubIt = std::find_if(m_publications.begin(), m_publications.end(),
        [offendingCommandCorrelationId](const PublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (pubIt != m_publications.end())
    {
        (*pubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*pubIt).m_errorCode = errorCode;
        (*pubIt).m_errorMessage = errorMessage;
        return;
    }

    auto exPubIt = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [offendingCommandCorrelationId](const ExclusivePublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (exPubIt != m_exclusivePublications.end())
    {
        (*exPubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*exPubIt).m_errorCode = errorCode;
        (*exPubIt).m_errorMessage = errorMessage;
        return;
    }

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [offendingCommandCorrelationId](const CounterStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end())
    {
        (*counterIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*counterIt).m_errorCode = errorCode;
        (*counterIt).m_errorMessage = errorMessage;
        return;
    }
}